

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::completed(torrent *this)

{
  time_point32 now;
  
  maybe_done_flushing(this);
  set_state(this,seeding);
  now = time_now32();
  (this->m_became_seed).__d.__r = (rep_conflict)now.__d.__r;
  if ((this->field_0x5c0 & 0x40) == 0) {
    return;
  }
  tracker_list::completed(&this->m_trackers,now);
  announce_with_tracker(this,none);
  return;
}

Assistant:

void torrent::completed()
	{
		maybe_done_flushing();

		set_state(torrent_status::seeding);
		m_became_seed = aux::time_now32();

		if (!m_announcing) return;

		m_trackers.completed(m_became_seed);
		announce_with_tracker();
	}